

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

string * __thiscall
inja::Parser::load_file_abi_cxx11_(string *__return_storage_ptr__,Parser *this,string_view filename)

{
  undefined8 uVar1;
  allocator<char> local_241;
  string local_240;
  string_view filename_local;
  ifstream file;
  undefined8 auStack_128 [36];
  
  filename_local._M_str = filename._M_str;
  filename_local._M_len = filename._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_240,&filename_local,&local_241);
  open_file_or_throw((inja *)&file,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  uVar1 = *(undefined8 *)((long)auStack_128 + *(long *)(_file + -0x18));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,uVar1,0xffffffffffffffff,0,0xffffffff);
  std::ifstream::~ifstream(&file);
  return __return_storage_ptr__;
}

Assistant:

std::string load_file(nonstd::string_view filename) {
    std::ifstream file = open_file_or_throw(static_cast<std::string>(filename));
    std::string text((std::istreambuf_iterator<char>(file)), std::istreambuf_iterator<char>());
    return text;
  }